

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.h
# Opt level: O0

string * __thiscall
ast::Statement::more_listing_abi_cxx11_(string *__return_storage_ptr__,Statement *this)

{
  Statement *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

virtual string more_listing() {	return string(); }